

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode *pBVar1;
  BPMNode *pBVar2;
  BPMNode *pBVar3;
  BPMNode *pBVar4;
  ulong uVar5;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  BPMNode *leaves;
  ulong uVar9;
  BPMNode *pBVar10;
  BPMNode **ppBVar11;
  BPMNode **ppBVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  BPMNode *pBVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong numpresent;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  ulong uVar25;
  int iVar27;
  undefined1 auVar26 [16];
  BPMLists lists;
  BPMLists local_80;
  uint *local_48;
  size_t local_40;
  BPMNode *local_38;
  
  if ((uint)(1 << ((byte)maxbitlen & 0x1f)) < (uint)numcodes || numcodes == 0) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  uVar9 = 0;
  numpresent = 0;
  do {
    if (frequencies[uVar9] != 0) {
      leaves[numpresent].weight = frequencies[uVar9];
      leaves[numpresent].index = (uint)uVar9;
      numpresent = numpresent + 1;
    }
    uVar9 = uVar9 + 1;
  } while ((uVar9 & 0xffffffff) != numcodes);
  uVar9 = 0;
  do {
    lengths[uVar9] = 0;
    uVar9 = uVar9 + 1;
  } while ((uVar9 & 0xffffffff) != numcodes);
  if (numpresent == 1) {
    uVar15 = leaves->index;
    lengths[uVar15] = 1;
    lengths[(ulong)uVar15 == 0] = 1;
  }
  else {
    if (numpresent != 0) {
      local_40 = numpresent * 0x18;
      local_48 = lengths;
      pBVar10 = (BPMNode *)malloc(local_40);
      uVar9 = 1;
      bVar7 = false;
      do {
        bVar17 = bVar7;
        pBVar16 = leaves;
        pBVar3 = pBVar10;
        if (!bVar17) {
          pBVar16 = pBVar10;
          pBVar3 = leaves;
        }
        uVar13 = uVar9 * 2;
        uVar19 = 0;
        do {
          uVar25 = uVar19 + uVar9;
          if (numpresent <= uVar19 + uVar9) {
            uVar25 = numpresent;
          }
          uVar18 = uVar19 + uVar13;
          pBVar4 = pBVar16;
          uVar21 = uVar25;
          uVar5 = uVar19;
          uVar23 = numpresent;
          if (uVar18 < numpresent) {
            uVar23 = uVar18;
          }
          for (; uVar19 < uVar23; uVar19 = uVar19 + 1) {
            if ((uVar5 < uVar25) &&
               ((uVar23 <= uVar21 || (pBVar3[uVar5].weight <= pBVar3[uVar21].weight)))) {
              uVar22 = uVar5 + 1;
              uVar20 = uVar5;
            }
            else {
              uVar20 = uVar21;
              uVar21 = uVar21 + 1;
              uVar22 = uVar5;
            }
            uVar6 = *(undefined4 *)&pBVar3[uVar20].field_0x14;
            pBVar4->in_use = pBVar3[uVar20].in_use;
            *(undefined4 *)&pBVar4->field_0x14 = uVar6;
            pBVar1 = pBVar3 + uVar20;
            uVar15 = pBVar1->index;
            pBVar2 = pBVar1->tail;
            pBVar4->weight = pBVar1->weight;
            pBVar4->index = uVar15;
            pBVar4->tail = pBVar2;
            pBVar4 = pBVar4 + 1;
            uVar5 = uVar22;
          }
          pBVar16 = pBVar16 + uVar9 * 2;
          uVar19 = uVar18;
        } while (uVar18 < numpresent);
        uVar9 = uVar13;
        bVar7 = (bool)(bVar17 ^ 1);
      } while (uVar13 < numpresent);
      local_38 = leaves;
      if (!bVar17) {
        memcpy(leaves,pBVar10,local_40);
      }
      free(pBVar10);
      local_80.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar9 = (ulong)local_80.memsize;
      local_80.nextfree = 0;
      local_80.numfree = local_80.memsize;
      local_80.listsize = maxbitlen;
      pBVar10 = (BPMNode *)malloc(uVar9 * 0x18);
      local_80.memory = pBVar10;
      ppBVar11 = (BPMNode **)malloc(uVar9 * 8);
      local_80.freelist = ppBVar11;
      ppBVar12 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      local_80.chains0 = ppBVar12;
      local_80.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      iVar27 = (int)((ulong)pBVar10 >> 0x20);
      auVar26._0_4_ = -(uint)(iVar27 == 0 && (int)pBVar10 == 0);
      auVar26._4_4_ = -(uint)((int)ppBVar11 == 0 && (int)((ulong)ppBVar11 >> 0x20) == 0);
      auVar26._8_4_ = -(uint)((int)((ulong)ppBVar12 >> 0x20) == 0 && (int)ppBVar12 == 0);
      auVar26._12_4_ =
           -(uint)((int)local_80.chains1 == 0 && (int)((ulong)local_80.chains1 >> 0x20) == 0);
      iVar8 = movmskps((int)local_80.chains1,auVar26);
      uVar15 = 0x53;
      if (iVar8 == 0) {
        if (uVar9 != 0) {
          uVar19 = 0;
          uVar25 = 1;
          uVar13 = 0;
          auVar24._8_4_ = (int)pBVar10;
          auVar24._0_8_ = pBVar10;
          auVar24._12_4_ = iVar27;
          do {
            ppBVar11[uVar13] =
                 (BPMNode *)
                 ((long)&pBVar10[uVar19 & 0xffffffff].weight + ((uVar19 >> 0x20) * 0x18 << 0x20));
            (ppBVar11 + uVar13)[1] =
                 (BPMNode *)
                 (((uVar25 >> 0x20) * 0x18 << 0x20) + (uVar25 & 0xffffffff) * 0x18 + auVar24._8_8_);
            uVar13 = uVar13 + 2;
            uVar19 = uVar19 + 2;
            uVar25 = uVar25 + 2;
          } while (uVar9 != uVar13);
        }
        bpmnode_create(&local_80,leaves->weight,1,(BPMNode *)0x0);
        bpmnode_create(&local_80,leaves[1].weight,2,(BPMNode *)0x0);
        if ((ulong)local_80.listsize != 0) {
          uVar9 = 0;
          do {
            local_80.chains0[uVar9] = local_80.memory;
            local_80.chains1[uVar9] = local_80.memory + 1;
            uVar9 = uVar9 + 1;
          } while (local_80.listsize != uVar9);
        }
        uVar9 = numpresent * 2 - 2;
        if (uVar9 != 2) {
          uVar13 = 2;
          do {
            boundaryPM(&local_80,leaves,numpresent,maxbitlen - 1,(int)uVar13);
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (uVar9 != uVar13);
        }
        uVar15 = 0;
        for (pBVar10 = local_80.chains1[maxbitlen - 1]; pBVar10 != (BPMNode *)0x0;
            pBVar10 = pBVar10->tail) {
          if (pBVar10->index != 0) {
            uVar9 = 0;
            do {
              local_48[leaves[uVar9].index] = local_48[leaves[uVar9].index] + 1;
              uVar14 = (int)uVar9 + 1;
              uVar9 = (ulong)uVar14;
            } while (uVar14 != pBVar10->index);
          }
        }
      }
      ppBVar11 = local_80.chains1;
      free(local_80.memory);
      free(local_80.freelist);
      free(local_80.chains0);
      free(ppBVar11);
      goto LAB_00103c11;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar15 = 0;
LAB_00103c11:
  free(leaves);
  return uVar15;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i) {
    if(frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  } else if(numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  } else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error) {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}